

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TDeletingArray<FVoxelDef_*,_FVoxelDef_*>::~TDeletingArray
          (TDeletingArray<FVoxelDef_*,_FVoxelDef_*> *this)

{
  FVoxelDef *pFVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (this->super_TArray<FVoxelDef_*,_FVoxelDef_*>).Count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      pFVar1 = (this->super_TArray<FVoxelDef_*,_FVoxelDef_*>).Array[uVar3];
      if (pFVar1 != (FVoxelDef *)0x0) {
        operator_delete(pFVar1,0x28);
        uVar2 = (this->super_TArray<FVoxelDef_*,_FVoxelDef_*>).Count;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  TArray<FVoxelDef_*,_FVoxelDef_*>::~TArray(&this->super_TArray<FVoxelDef_*,_FVoxelDef_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}